

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.hpp
# Opt level: O2

void msgpack::v3::unpack(object_handle *result,char *data,size_t len,size_t *off,bool *referenced,
                        unpack_reference_func f,void *user_data,unpack_limit *limit)

{
  parse_return pVar1;
  __uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true> this;
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> z;
  object obj;
  
  obj.super_object.type = NIL;
  this.super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)
       v1::zone::operator_new((zone *)0x38,(size_t)data);
  v1::zone::zone((zone *)this.
                         super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                         .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl,0x2000);
  *referenced = false;
  z._M_t.super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       this.super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
       super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
       super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl;
  pVar1 = v2::detail::unpack_imp
                    (data,len,off,
                     (zone *)this.
                             super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                             .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl,&obj,
                     referenced,f,user_data,limit);
  if ((uint)(pVar1 + PARSE_PARSE_ERROR) < 2) {
    (result->m_obj).super_object.via.array.ptr = obj.super_object.via.array.ptr;
    *(ulong *)&(result->m_obj).super_object = CONCAT44(obj.super_object._4_4_,obj.super_object.type)
    ;
    (result->m_obj).super_object.via.u64 = obj.super_object.via.u64;
    z._M_t.super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
    super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
    super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
         (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
         (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)0x0;
    std::__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::reset
              ((__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> *)
               &result->m_zone,
               (pointer)this.
                        super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                        .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl);
  }
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr(&z);
  return;
}

Assistant:

inline void unpack(
    msgpack::object_handle& result,
    const char* data, std::size_t len, std::size_t& off, bool& referenced,
    msgpack::unpack_reference_func f, void* user_data,
    msgpack::unpack_limit const& limit)
{
    msgpack::object obj;
    msgpack::unique_ptr<msgpack::zone> z(new msgpack::zone);
    referenced = false;
    parse_return ret = detail::unpack_imp(
        data, len, off, *z, obj, referenced, f, user_data, limit);

    switch(ret) {
    case PARSE_SUCCESS:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    case PARSE_EXTRA_BYTES:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    default:
        return;
    }
}